

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFFFundamentalParameterData.cpp
# Opt level: O0

bool __thiscall
DIS::IFFFundamentalParameterData::operator==
          (IFFFundamentalParameterData *this,IFFFundamentalParameterData *rhs)

{
  byte local_1a;
  bool local_19;
  uchar idx;
  bool ivarsEqual;
  IFFFundamentalParameterData *rhs_local;
  IFFFundamentalParameterData *this_local;
  
  local_19 = true;
  if ((this->_erp != rhs->_erp) || (NAN(this->_erp) || NAN(rhs->_erp))) {
    local_19 = false;
  }
  if ((this->_frequency != rhs->_frequency) || (NAN(this->_frequency) || NAN(rhs->_frequency))) {
    local_19 = false;
  }
  if ((this->_pgrf != rhs->_pgrf) || (NAN(this->_pgrf) || NAN(rhs->_pgrf))) {
    local_19 = false;
  }
  if ((this->_pulseWidth != rhs->_pulseWidth) || (NAN(this->_pulseWidth) || NAN(rhs->_pulseWidth)))
  {
    local_19 = false;
  }
  if (this->_burstLength != rhs->_burstLength) {
    local_19 = false;
  }
  if (this->_applicableModes != rhs->_applicableModes) {
    local_19 = false;
  }
  for (local_1a = 0; local_1a < 3; local_1a = local_1a + 1) {
    if (this->_systemSpecificData[local_1a] != rhs->_systemSpecificData[local_1a]) {
      local_19 = false;
    }
  }
  return local_19;
}

Assistant:

bool IFFFundamentalParameterData::operator ==(const IFFFundamentalParameterData& rhs) const
 {
     bool ivarsEqual = true;

     if( ! (_erp == rhs._erp) ) ivarsEqual = false;
     if( ! (_frequency == rhs._frequency) ) ivarsEqual = false;
     if( ! (_pgrf == rhs._pgrf) ) ivarsEqual = false;
     if( ! (_pulseWidth == rhs._pulseWidth) ) ivarsEqual = false;
     if( ! (_burstLength == rhs._burstLength) ) ivarsEqual = false;
     if( ! (_applicableModes == rhs._applicableModes) ) ivarsEqual = false;

     for(unsigned char idx = 0; idx < 3; idx++)
     {
          if(!(_systemSpecificData[idx] == rhs._systemSpecificData[idx]) ) ivarsEqual = false;
     }


    return ivarsEqual;
 }